

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

string * __thiscall
pfederc::NumberToken::toString_abi_cxx11_
          (string *__return_storage_ptr__,NumberToken *this,Lexer *lexer)

{
  byte bVar1;
  ushort uVar2;
  uint64_t uVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  char cVar7;
  long *plVar8;
  uint uVar9;
  ulong uVar10;
  size_type *psVar11;
  ulong uVar12;
  char cVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch((this->super_Token).type) {
  case TOK_INT8:
    uVar16 = (uint)*(char *)&this->num;
    uVar14 = -uVar16;
    if (0 < (int)uVar16) {
      uVar14 = uVar16;
    }
    uVar15 = 1;
    if (9 < uVar14) {
      uVar15 = 3 - (uVar14 < 100);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar15 - (*(char *)&this->num >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_50._M_dataplus._M_p + (uVar16 >> 0x1f),uVar15,uVar14);
    plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_50,
                                CONCAT44(local_50._M_string_length._4_4_,
                                         (uint)local_50._M_string_length),0,'\x01');
    break;
  case TOK_INT16:
    uVar16 = (uint)*(short *)&this->num;
    uVar14 = -uVar16;
    if (0 < (int)uVar16) {
      uVar14 = uVar16;
    }
    uVar15 = 1;
    if (((9 < uVar14) && (uVar15 = 2, 99 < uVar14)) && (uVar15 = 3, 999 < uVar14)) {
      uVar15 = 5 - (uVar14 < 10000);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_50,(char)uVar15 - (char)(*(short *)&this->num >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_50._M_dataplus._M_p + (uVar16 >> 0x1f),uVar15,uVar14);
    plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_50,
                                CONCAT44(local_50._M_string_length._4_4_,
                                         (uint)local_50._M_string_length),0,'\x01');
    break;
  case TOK_INT32:
    uVar14 = *(uint *)&this->num;
    uVar16 = -uVar14;
    if (0 < (int)uVar14) {
      uVar16 = uVar14;
    }
    uVar15 = 1;
    if (9 < uVar16) {
      uVar12 = (ulong)uVar16;
      uVar6 = 4;
      do {
        uVar15 = uVar6;
        uVar9 = (uint)uVar12;
        if (uVar9 < 100) {
          uVar15 = uVar15 - 2;
          goto LAB_00105200;
        }
        if (uVar9 < 1000) {
          uVar15 = uVar15 - 1;
          goto LAB_00105200;
        }
        if (uVar9 < 10000) goto LAB_00105200;
        uVar12 = uVar12 / 10000;
        uVar6 = uVar15 + 4;
      } while (99999 < uVar9);
      uVar15 = uVar15 + 1;
    }
LAB_00105200:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)uVar15 - (char)((int)uVar14 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar14 >> 0x1f),uVar15,uVar16);
    return __return_storage_ptr__;
  case TOK_INT64:
    uVar3 = (this->num).u64;
    uVar12 = -uVar3;
    if (0 < (long)uVar3) {
      uVar12 = uVar3;
    }
    uVar14 = 1;
    if (9 < uVar12) {
      uVar10 = uVar12;
      uVar16 = 4;
      do {
        uVar14 = uVar16;
        if (uVar10 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_00105234;
        }
        if (uVar10 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_00105234;
        }
        if (uVar10 < 10000) goto LAB_00105234;
        bVar4 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        uVar16 = uVar14 + 4;
      } while (bVar4);
      uVar14 = uVar14 + 1;
    }
LAB_00105234:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar14 - (char)((long)uVar3 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_50._M_dataplus._M_p + -((long)uVar3 >> 0x3f),uVar14,uVar12);
    plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_50,
                                CONCAT44(local_50._M_string_length._4_4_,
                                         (uint)local_50._M_string_length),0,'\x01');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar11) {
      lVar5 = plVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0010535c;
  case TOK_UINT8:
    bVar1 = *(byte *)&this->num;
    uVar14 = 1;
    if (9 < bVar1) {
      uVar14 = 3 - (bVar1 < 100);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_50._M_dataplus._M_p,uVar14,(uint)bVar1);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
    break;
  case TOK_UINT16:
    uVar2 = *(ushort *)&this->num;
    uVar14 = (uint)uVar2;
    uVar16 = 1;
    if (((9 < uVar2) && (uVar16 = 2, 99 < uVar2)) && (uVar16 = 3, 999 < uVar14)) {
      uVar16 = 5 - (uVar14 < 10000);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar16);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_50._M_dataplus._M_p,uVar16,uVar14);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
    break;
  case TOK_UINT32:
    uVar14 = *(uint *)&this->num;
    cVar13 = '\x01';
    if (9 < uVar14) {
      uVar16 = uVar14;
      cVar7 = '\x04';
      do {
        cVar13 = cVar7;
        if (uVar16 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_0010537d;
        }
        if (uVar16 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_0010537d;
        }
        if (uVar16 < 10000) goto LAB_0010537d;
        bVar4 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar7 = cVar13 + '\x04';
      } while (bVar4);
      cVar13 = cVar13 + '\x01';
    }
LAB_0010537d:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,uVar14);
    plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_50,
                                CONCAT44(local_50._M_string_length._4_4_,
                                         (uint)local_50._M_string_length),0,'\x01');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar11) {
      lVar5 = plVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0010535c;
  case TOK_UINT64:
    uVar12 = (this->num).u64;
    cVar13 = '\x01';
    if (9 < uVar12) {
      uVar10 = uVar12;
      cVar7 = '\x04';
      do {
        cVar13 = cVar7;
        if (uVar10 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_001052d8;
        }
        if (uVar10 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_001052d8;
        }
        if (uVar10 < 10000) goto LAB_001052d8;
        bVar4 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar7 = cVar13 + '\x04';
      } while (bVar4);
      cVar13 = cVar13 + '\x01';
    }
LAB_001052d8:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,uVar12);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
    break;
  case TOK_FLT32:
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_50,vsnprintf,0x3a,"%f",SUB84((double)(this->num).f32,0));
    plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_50,
                                CONCAT44(local_50._M_string_length._4_4_,
                                         (uint)local_50._M_string_length),0,'\x01');
    goto LAB_0010518b;
  case TOK_FLT64:
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_50,vsnprintf,0x148,"%f",(this->num).f32);
    plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_50,
                                CONCAT44(local_50._M_string_length._4_4_,
                                         (uint)local_50._M_string_length),0,'\x01');
LAB_0010518b:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar11) {
      lVar5 = plVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0010535c;
  default:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unexpected number token type","");
    fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_lexer/src/token.cpp"
          ,0x17e,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar11) {
    lVar5 = plVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0010535c:
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NumberToken::toString(const Lexer &lexer) const noexcept {
  switch(getType()) {
  case TokenType::TOK_INT8:
    return std::to_string(i8()) + 's';
  case TokenType::TOK_INT16:
    return std::to_string(i16()) + 'S';
  case TokenType::TOK_INT32:
    return std::to_string(i32());
  case TokenType::TOK_INT64:
    return std::to_string(i64()) + 'L';
  case TokenType::TOK_UINT8:
    return std::to_string(u8()) + "us";
  case TokenType::TOK_UINT16:
    return std::to_string(u16()) + "uS";
  case TokenType::TOK_UINT32:
    return std::to_string(u32()) + 'u';
  case TokenType::TOK_UINT64:
    return std::to_string(u64()) + "uL";
  case TokenType::TOK_FLT32:
    return std::to_string(f32()) + 'f';
  case TokenType::TOK_FLT64:
    return std::to_string(f64()) + 'F';
  default:
    fatal(__FILE__, __LINE__, "Unexpected number token type");
    return "";
  }
}